

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

void __thiscall QFactoryLoader::setExtraSearchPath(QFactoryLoader *this,QString *path)

{
  long lVar1;
  bool bVar2;
  Private *this_00;
  Private *pPVar3;
  qsizetype qVar4;
  const_reference pbVar5;
  QObject *pQVar6;
  Private *in_RDI;
  long in_FS_OFFSET;
  value_type *plugin;
  qsizetype i;
  QString oldPath;
  QMutexLocker<QRecursiveMutex> locker;
  QString *in_stack_00000188;
  Private *in_stack_00000190;
  QRecursiveMutex *in_stack_ffffffffffffff18;
  QMutexLocker<QRecursiveMutex> *in_stack_ffffffffffffff20;
  QString *in_stack_ffffffffffffff28;
  Private *in_stack_ffffffffffffff58;
  Private *in_stack_ffffffffffffff60;
  long local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Private::operator->(in_RDI);
  bVar2 = ::operator==((QString *)in_stack_ffffffffffffff20,(QString *)in_stack_ffffffffffffff18);
  if (!bVar2) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>::
    operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                *)0x443b2b);
    QMutexLocker<QRecursiveMutex>::QMutexLocker(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
    ;
    this_00 = Private::operator->(in_RDI);
    std::exchange<QString,QString_const&>
              (in_stack_ffffffffffffff28,(QString *)in_stack_ffffffffffffff20);
    bVar2 = QString::isEmpty((QString *)0x443b9d);
    if (bVar2) {
      Private::operator->(in_RDI);
      Private::operator->(in_RDI);
      Private::updateSinglePath(in_stack_00000190,in_stack_00000188);
    }
    else {
      local_60 = 0;
      while( true ) {
        pPVar3 = Private::operator->(in_RDI);
        qVar4 = QList<bool>::size(&pPVar3->loadedLibraries);
        if (qVar4 <= local_60) break;
        in_stack_ffffffffffffff60 = Private::operator->(in_RDI);
        pbVar5 = QList<bool>::at((QList<bool> *)in_stack_ffffffffffffff20,
                                 (qsizetype)in_stack_ffffffffffffff18);
        if ((*pbVar5 & 1U) != 0) {
          in_stack_ffffffffffffff58 = Private::operator->(in_RDI);
          std::
          vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
          ::at((vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
          std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>::operator->
                    ((unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)0x443d08);
          pQVar6 = QPointer<QObject>::data((QPointer<QObject> *)0x443d14);
          if (pQVar6 != (QObject *)0x0) {
            (*pQVar6->_vptr_QObject[4])();
          }
        }
        local_60 = local_60 + 1;
      }
      Private::operator->(in_RDI);
      QList<bool>::fill((QList<bool> *)in_stack_ffffffffffffff60,
                        SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0),(qsizetype)this_00);
      Private::operator->(in_RDI);
      QDuplicateTracker<QString,_32UL>::clear
                ((QDuplicateTracker<QString,_32UL> *)in_stack_ffffffffffffff58);
      Private::operator->(in_RDI);
      std::
      vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
      ::clear((vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
               *)0x443db7);
      Private::operator->(in_RDI);
      std::
      map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
      ::clear((map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
               *)0x443dd9);
      update((QFactoryLoader *)this_00);
    }
    QString::~QString((QString *)0x443df4);
    QMutexLocker<QRecursiveMutex>::~QMutexLocker(in_stack_ffffffffffffff20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFactoryLoader::setExtraSearchPath(const QString &path)
{
#if QT_CONFIG(library)
    if (d->extraSearchPath == path)
        return;             // nothing to do

    QMutexLocker locker(&qt_factoryloader_global->mutex);
    QString oldPath = std::exchange(d->extraSearchPath, path);
    if (oldPath.isEmpty()) {
        // easy case, just update this directory
        d->updateSinglePath(d->extraSearchPath);
    } else {
        // must re-scan everything
        for (qsizetype i = 0; i < d->loadedLibraries.size(); ++i) {
            if (d->loadedLibraries.at(i)) {
                auto &plugin = d->libraries.at(i);
                delete plugin->inst.data();
            }
        }
        d->loadedLibraries.fill(false);
        d->loadedPaths.clear();
        d->libraries.clear();
        d->keyMap.clear();
        update();
    }
#else
    Q_UNUSED(path);
#endif
}